

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

ssize_t __thiscall fmp4_stream::box::read(box *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  uint32_t uVar2;
  int iVar3;
  reference pvVar4;
  uint64_t uVar5;
  size_type sVar6;
  box *pbVar7;
  undefined4 in_register_00000034;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint8_t offset;
  allocator<char> local_41;
  string local_40 [32];
  char *local_20;
  istream *istr_local;
  box *this_local;
  
  local_20 = (char *)CONCAT44(in_register_00000034,__fd);
  this_00 = &this->box_data_;
  istr_local = (istream *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,9);
  pcVar1 = local_20;
  this->large_size_ = 0;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
  std::istream::read(pcVar1,(long)pvVar4);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
  uVar2 = anon_unknown.dwarf_124a5::fmp4_read_uint32((char *)pvVar4);
  this->size_ = uVar2;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,8);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)pvVar4,&local_41);
  std::__cxx11::string::operator=((string *)&this->box_type_,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  iVar3 = std::__cxx11::string::compare((char *)&this->box_type_);
  if (iVar3 == 0) {
    this->has_uuid_ = true;
  }
  if (this->size_ == 1) {
    this->is_large_ = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->box_data_,0x10);
    pcVar1 = local_20;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->box_data_,8);
    std::istream::read(pcVar1,(long)pvVar4);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->box_data_,8);
    uVar5 = anon_unknown.dwarf_124a5::fmp4_read_uint64((char *)pvVar4);
    this->large_size_ = uVar5;
  }
  else {
    this->large_size_ = (ulong)this->size_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->box_data_,8);
  }
  if (this->size_ == 0) {
    this_local._7_1_ = 0;
  }
  else {
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->box_data_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->box_data_,this->large_size_);
    pcVar1 = local_20;
    pbVar7 = (box *)(this->large_size_ - (sVar6 & 0xff));
    if (pbVar7 != (box *)0x0) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->box_data_,sVar6 & 0xff);
      pbVar7 = (box *)std::istream::read(pcVar1,(long)pvVar4);
    }
    this_local._7_1_ = 1;
    this = pbVar7;
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool box::read(std::istream &istr)
	{
		box_data_.resize(9);
		large_size_ = 0;

		istr.read((char*)&box_data_[0], 8);
		size_ = fmp4_read_uint32((char *)&box_data_[0]);
		box_data_[8] = (uint8_t) '\0';
		box_type_ = std::string((char *)&box_data_[4]);
		if (box_type_.compare("uuid") == 0)
			has_uuid_ = true;

		// detect large size box 
		if (size_ == 1)
		{
			is_large_ = true;
			box_data_.resize(16);
			istr.read((char *)&box_data_[8], 8);
			large_size_ = fmp4_read_uint64((char *)&box_data_[8]);
		}
		else 
		{
			large_size_ = size_;
			box_data_.resize(8);
		}

		// read all the bytes from the stream
		if (size_) 
		{
			// write the offset bytes of the box
			uint8_t offset = (uint8_t)box_data_.size();
			box_data_.resize(large_size_);
			if ((large_size_ - offset) > 0)
				istr.read((char*)&box_data_[offset], large_size_ - offset);
			return true;
		}

		return false;
	}